

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_x11.c
# Opt level: O2

int main(int argc,char **argv)

{
  ATimeUs AVar1;
  int iVar2;
  ATimeUs AVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  long lVar6;
  uint uVar7;
  AKey AVar8;
  uint uVar9;
  char *pcVar10;
  int iVar11;
  bool bVar12;
  EGLConfig config;
  ATimeUs local_180;
  EGLint num_config;
  EGLint ver_maj;
  EGLint ver_min;
  Atom delete_message;
  int num_visuals;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  ulong uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  XVisualInfo xvisual_info;
  int local_b8;
  int local_b4;
  int local_a4;
  
  AVar1 = aAppTime();
  a__x11_0 = XOpenDisplay(0);
  if (a__x11_0 == 0) {
    pcVar10 = "a__x11.display = XOpenDisplay(NULL)";
    uVar4 = 0xff;
  }
  else {
    eglBindAPI(0x30a2);
    a_app_egl_display = (EGLDisplay)eglGetDisplay(a__x11_0);
    if (a_app_egl_display == (EGLDisplay)0x0) {
      pcVar10 = "EGL_NO_DISPLAY != (a_app_egl_display = eglGetDisplay(a__x11.display))";
      uVar4 = 0x10e;
    }
    else {
      iVar2 = eglInitialize(a_app_egl_display,&ver_maj,&ver_min);
      if (iVar2 == 0) {
        pcVar10 = "eglInitialize(a_app_egl_display, &ver_maj, &ver_min)";
        uVar4 = 0x10f;
      }
      else {
        aAppDebugPrintf("EGL: version %d.%d",(ulong)(uint)ver_maj,(ulong)(uint)ver_min);
        uVar4 = eglQueryString(a_app_egl_display,0x3054);
        aAppDebugPrintf("EGL: EGL_VERSION: \'%s\'",uVar4);
        uVar4 = eglQueryString(a_app_egl_display,0x3053);
        aAppDebugPrintf("EGL: EGL_VENDOR: \'%s\'",uVar4);
        uVar4 = eglQueryString(a_app_egl_display,0x308d);
        aAppDebugPrintf("EGL: EGL_CLIENT_APIS: \'%s\'",uVar4);
        uVar4 = eglQueryString(a_app_egl_display,0x3055);
        aAppDebugPrintf("EGL: EGL_EXTENSIONS: \'%s\'",uVar4);
        iVar2 = eglChooseConfig(a_app_egl_display,a__app_egl_config_attrs,&config,1,&num_config);
        if (iVar2 == 0) {
          pcVar10 = 
          "eglChooseConfig(a_app_egl_display, a__app_egl_config_attrs, &config, 1, &num_config)";
          uVar4 = 0x11c;
        }
        else if (num_config < 1) {
          pcVar10 = "num_config > 0";
          uVar4 = 0x11e;
        }
        else {
          xvisual_info.blue_mask = 0;
          xvisual_info.colormap_size = 0;
          xvisual_info.bits_per_rgb = 0;
          xvisual_info.red_mask = 0;
          xvisual_info.green_mask = 0;
          xvisual_info.screen = 0;
          xvisual_info.depth = 0;
          xvisual_info.class = 0;
          xvisual_info._28_4_ = 0;
          xvisual_info.visual = (Visual *)0x0;
          xvisual_info.visualid = 0;
          iVar2 = eglGetConfigAttrib(a_app_egl_display,config,0x302e);
          if (iVar2 == 0) {
            pcVar10 = 
            "eglGetConfigAttrib(a_app_egl_display, config, EGL_NATIVE_VISUAL_ID, (EGLint*)&xvisual_info.visualid)"
            ;
            uVar4 = 0x123;
          }
          else {
            puVar5 = (undefined8 *)XGetVisualInfo(a__x11_0,3,&xvisual_info,&num_visuals);
            if (puVar5 == (undefined8 *)0x0) {
              pcVar10 = 
              "vinfo = XGetVisualInfo(a__x11.display, VisualScreenMask | VisualIDMask, &xvisual_info, &num_visuals)"
              ;
              uVar4 = 0x126;
            }
            else {
              local_128 = 0;
              uStack_140 = 0;
              _num_visuals = 0;
              uStack_160 = 0;
              local_158 = 0;
              uStack_150 = 0;
              local_138 = 0;
              uStack_130 = 0;
              local_118 = 0;
              uStack_110 = 0;
              local_108 = 0;
              uStack_100 = 0;
              uStack_120 = 0x3804f;
              local_148 = 10;
              local_108 = XCreateColormap(a__x11_0,*(undefined8 *)
                                                    (*(long *)(a__x11_0 + 0xe8) + 0x10 +
                                                    (long)*(int *)(puVar5 + 2) * 0x80),*puVar5,0);
              uStack_110 = uStack_110 & 0xffffffff00000000;
              a__x11_1 = XCreateWindow(a__x11_0,*(undefined8 *)
                                                 (*(long *)(a__x11_0 + 0xe8) + 0x10 +
                                                 (long)*(int *)(puVar5 + 2) * 0x80),0,0,0x500,0x2d0,
                                       0,*(undefined4 *)((long)puVar5 + 0x14),1,*puVar5,0x2818,
                                       &num_visuals);
              if (a__x11_1 == 0) {
                pcVar10 = "a__x11.window";
                uVar4 = 0x136;
              }
              else {
                XStoreName(a__x11_0,a__x11_1,"atto app");
                delete_message = XInternAtom(a__x11_0,"WM_DELETE_WINDOW",1);
                XSetWMProtocols(a__x11_0,a__x11_1,&delete_message,1);
                XMapWindow(a__x11_0,a__x11_1);
                XkbSetDetectableAutoRepeat(a__x11_0,1,0);
                a__app_egl_0 = eglCreateContext(a_app_egl_display,config,0,a__app_egl_context_attrs)
                ;
                if (a__app_egl_0 == 0) {
                  pcVar10 = "EGL_NO_CONTEXT != a__app_egl.context";
                  uVar4 = 0x149;
                }
                else {
                  a__app_egl_1 = eglCreateWindowSurface(a_app_egl_display,config,a__x11_1,0);
                  if (a__app_egl_1 == 0) {
                    pcVar10 = "EGL_NO_SURFACE != a__app_egl.surface";
                    uVar4 = 0x14d;
                  }
                  else {
                    iVar2 = eglMakeCurrent(a_app_egl_display,a__app_egl_1,a__app_egl_1,a__app_egl_0)
                    ;
                    if (iVar2 != 0) {
                      XSelectInput(a__x11_0,a__x11_1,0x2004f);
                      a__app_state.gl_version = AOGLV_21;
                      a__app_state.width = 0x500;
                      a__app_state.height = 0x2d0;
                      a__app_state.argc = argc;
                      a__app_state.argv = argv;
                      attoAppInit(&a__app_proctable);
                      if (a__app_proctable.resize != (_func_void_ATimeUs_uint_uint *)0x0) {
                        (*a__app_proctable.resize)(AVar1,0,0);
                      }
                      AVar1 = 0;
switchD_00101b40_caseD_7:
                      while (local_180 = AVar1, iVar2 = XPending(a__x11_0), iVar2 == 0) {
                        AVar1 = aAppTime();
                        if (a__app_proctable.paint != (_func_void_ATimeUs_float *)0x0) {
                          uVar9 = AVar1 - local_180;
                          if (local_180 == 0) {
                            uVar9 = 0;
                          }
                          (*a__app_proctable.paint)(AVar1,(float)uVar9 * 1e-06);
                        }
                        iVar2 = eglSwapBuffers(a_app_egl_display,a__app_egl_1);
                        if (iVar2 == 0) {
                          pcVar10 = "eglSwapBuffers(a_app_egl_display, a__app_egl.surface)";
                          uVar4 = 0x18d;
                          goto LAB_0010226e;
                        }
                      }
                      XNextEvent(a__x11_0,&xvisual_info);
                      uVar9 = a__app_state.height;
                      AVar1 = local_180;
                      switch((int)xvisual_info.visual) {
                      case 2:
                      case 3:
                        AVar3 = aAppTime();
                        bVar12 = (int)xvisual_info.visual == 2;
                        lVar6 = XLookupKeysym(&xvisual_info,0);
                        AVar1 = local_180;
                        switch(lVar6) {
                        case 0x20:
                          AVar8 = AK_Space;
                          break;
                        case 0x21:
                        case 0x22:
                        case 0x23:
                        case 0x24:
                        case 0x25:
                        case 0x26:
                        case 0x27:
                        case 0x28:
                        case 0x29:
                        case 0x2b:
                        case 0x3a:
                        case 0x3b:
                        case 0x3c:
                        case 0x3e:
                        case 0x3f:
                        case 0x40:
                        case 0x41:
                        case 0x42:
                        case 0x43:
                        case 0x44:
                        case 0x45:
                        case 0x46:
                        case 0x47:
                        case 0x48:
                        case 0x49:
                        case 0x4a:
                        case 0x4b:
                        case 0x4c:
                        case 0x4d:
                        case 0x4e:
                        case 0x4f:
                        case 0x50:
                        case 0x51:
                        case 0x52:
                        case 0x53:
                        case 0x54:
                        case 0x55:
                        case 0x56:
                        case 0x57:
                        case 0x58:
                        case 0x59:
                        case 0x5a:
                        case 0x5b:
                        case 0x5c:
                        case 0x5d:
                        case 0x5e:
                        case 0x5f:
                        case 0x60:
                          goto switchD_00101b40_caseD_7;
                        case 0x2a:
                          AVar8 = AK_KeypadAsterisk;
                          break;
                        case 0x2c:
                          AVar8 = AK_Comma;
                          break;
                        case 0x2d:
                          AVar8 = AK_Minus;
                          break;
                        case 0x2e:
                          AVar8 = AK_Dot;
                          break;
                        case 0x2f:
                          AVar8 = AK_Slash;
                          break;
                        case 0x30:
                          AVar8 = AK_0;
                          break;
                        case 0x31:
                          AVar8 = AK_1;
                          break;
                        case 0x32:
                          AVar8 = AK_2;
                          break;
                        case 0x33:
                          AVar8 = AK_3;
                          break;
                        case 0x34:
                          AVar8 = AK_4;
                          break;
                        case 0x35:
                          AVar8 = AK_5;
                          break;
                        case 0x36:
                          AVar8 = AK_6;
                          break;
                        case 0x37:
                          AVar8 = AK_7;
                          break;
                        case 0x38:
                          AVar8 = AK_8;
                          break;
                        case 0x39:
                          AVar8 = AK_9;
                          break;
                        case 0x3d:
                          AVar8 = AK_Equal;
                          break;
                        case 0x61:
                          AVar8 = AK_A;
                          break;
                        case 0x62:
                          AVar8 = AK_B;
                          break;
                        case 99:
                          AVar8 = AK_C;
                          break;
                        case 100:
                          AVar8 = AK_D;
                          break;
                        case 0x65:
                          AVar8 = AK_E;
                          break;
                        case 0x66:
                          AVar8 = AK_F;
                          break;
                        case 0x67:
                          AVar8 = AK_G;
                          break;
                        case 0x68:
                          AVar8 = AK_H;
                          break;
                        case 0x69:
                          AVar8 = AK_I;
                          break;
                        case 0x6a:
                          AVar8 = AK_J;
                          break;
                        case 0x6b:
                          AVar8 = AK_K;
                          break;
                        case 0x6c:
                          AVar8 = AK_L;
                          break;
                        case 0x6d:
                          AVar8 = AK_M;
                          break;
                        case 0x6e:
                          AVar8 = AK_N;
                          break;
                        case 0x6f:
                          AVar8 = AK_O;
                          break;
                        case 0x70:
                          AVar8 = AK_P;
                          break;
                        case 0x71:
                          AVar8 = AK_Q;
                          break;
                        case 0x72:
                          AVar8 = AK_R;
                          break;
                        case 0x73:
                          AVar8 = AK_S;
                          break;
                        case 0x74:
                          AVar8 = AK_T;
                          break;
                        case 0x75:
                          AVar8 = AK_U;
                          break;
                        case 0x76:
                          AVar8 = AK_V;
                          break;
                        case 0x77:
                          AVar8 = AK_W;
                          break;
                        case 0x78:
                          AVar8 = AK_X;
                          break;
                        case 0x79:
                          AVar8 = AK_Y;
                          break;
                        case 0x7a:
                          AVar8 = AK_Z;
                          break;
                        default:
                          switch(lVar6) {
                          case 0xffab:
                            AVar8 = AK_KeypadPlus;
                            break;
                          case 0xffac:
                          case 0xffae:
                          case 0xffaf:
                          case 0xffb0:
                          case 0xffb1:
                          case 0xffb2:
                          case 0xffb3:
                          case 0xffb4:
                          case 0xffb5:
                          case 0xffb6:
                          case 0xffb7:
                          case 0xffb8:
                          case 0xffb9:
                          case 0xffba:
                          case 0xffbb:
                          case 0xffbc:
                          case 0xffbd:
                            goto switchD_00101b40_caseD_7;
                          case 0xffad:
                            AVar8 = AK_KeypadMinus;
                            break;
                          case 0xffbe:
                            AVar8 = AK_F1;
                            break;
                          case 0xffbf:
                            AVar8 = AK_F2;
                            break;
                          case 0xffc0:
                            AVar8 = AK_F3;
                            break;
                          case 0xffc1:
                            AVar8 = AK_F4;
                            break;
                          case 0xffc2:
                            AVar8 = AK_F5;
                            break;
                          case 0xffc3:
                            AVar8 = AK_F6;
                            break;
                          case 0xffc4:
                            AVar8 = AK_F7;
                            break;
                          case 0xffc5:
                            AVar8 = AK_F8;
                            break;
                          case 0xffc6:
                            AVar8 = AK_F9;
                            break;
                          case 0xffc7:
                            AVar8 = AK_F10;
                            break;
                          case 0xffc8:
                            AVar8 = AK_F11;
                            break;
                          case 0xffc9:
                            AVar8 = AK_F12;
                            break;
                          default:
                            switch(lVar6) {
                            case 0xffe1:
                              AVar8 = AK_LeftShift;
                              break;
                            case 0xffe2:
                              AVar8 = AK_RightShift;
                              break;
                            case 0xffe3:
                              AVar8 = AK_LeftCtrl;
                              break;
                            case 0xffe4:
                              AVar8 = AK_RightCtrl;
                              break;
                            case 0xffe5:
                              AVar8 = AK_Capslock;
                              break;
                            case 0xffe6:
                              goto switchD_00101b40_caseD_7;
                            case 0xffe7:
                              AVar8 = AK_LeftMeta;
                              break;
                            case 0xffe8:
                              AVar8 = AK_RightMeta;
                              break;
                            case 0xffe9:
                              AVar8 = AK_LeftAlt;
                              break;
                            case 0xffea:
                              AVar8 = AK_RightAlt;
                              break;
                            case 0xffeb:
                              AVar8 = AK_LeftSuper;
                              break;
                            case 0xffec:
                              AVar8 = AK_RightSuper;
                              break;
                            default:
                              switch(lVar6) {
                              case 0xff50:
                                AVar8 = AK_Home;
                                break;
                              case 0xff51:
                                AVar8 = AK_Left;
                                break;
                              case 0xff52:
                                AVar8 = AK_Up;
                                break;
                              case 0xff53:
                                AVar8 = AK_Right;
                                break;
                              case 0xff54:
                                AVar8 = AK_Down;
                                break;
                              case 0xff55:
                                AVar8 = AK_PageUp;
                                break;
                              case 0xff56:
                                AVar8 = AK_PageDown;
                                break;
                              case 0xff57:
                                AVar8 = AK_End;
                                break;
                              case 0xff58:
                              case 0xff59:
                              case 0xff5a:
                              case 0xff5b:
                              case 0xff5c:
                              case 0xff5d:
                              case 0xff5e:
                              case 0xff5f:
                              case 0xff60:
                              case 0xff61:
                              case 0xff62:
                                goto switchD_00101b40_caseD_7;
                              case 0xff63:
                                AVar8 = AK_Ins;
                                break;
                              default:
                                AVar8 = AK_Backspace;
                                if (lVar6 != 0xff08) {
                                  if (lVar6 == 0xffff) {
                                    AVar8 = AK_Del;
                                  }
                                  else if (lVar6 == 0xff0d) {
                                    AVar8 = AK_Enter;
                                  }
                                  else if (lVar6 == 0xff1b) {
                                    AVar8 = AK_Esc;
                                  }
                                  else {
                                    if (lVar6 != 0xff09) goto switchD_00101b40_caseD_7;
                                    AVar8 = AK_Tab;
                                  }
                                }
                              }
                            }
                          }
                        }
                        uVar9 = (uint)bVar12;
                        if ((a__app_state.keys[AVar8] != uVar9) &&
                           (a__app_state.keys[AVar8] = uVar9,
                           a__app_proctable.key != (_func_void_ATimeUs_AKey_int *)0x0)) {
                          (*a__app_proctable.key)(AVar3,AVar8,uVar9);
                          AVar1 = local_180;
                        }
                        goto switchD_00101b40_caseD_7;
                      case 4:
                      case 5:
                        AVar3 = aAppTime();
                        iVar11 = a__app_state.pointer.y;
                        iVar2 = a__app_state.pointer.x;
                        uVar9 = 0;
                        if (local_a4 - 1U < 5) {
                          uVar9 = *(uint *)(&DAT_001034a8 + (ulong)(local_a4 - 1U) * 4);
                        }
                        uVar7 = uVar9 & a__app_state.pointer.buttons;
                        if ((int)xvisual_info.visual == 4) {
                          uVar7 = a__app_state.pointer.buttons ^ uVar9;
                        }
                        a__app_state.pointer.buttons = a__app_state.pointer.buttons ^ uVar7;
                        a__app_state.pointer.x = local_b8;
                        a__app_state.pointer.y = local_b4;
                        AVar1 = local_180;
                        if (a__app_proctable.pointer != (_func_void_ATimeUs_int_int_uint *)0x0) {
                          (*a__app_proctable.pointer)
                                    (AVar3,local_b8 - iVar2,local_b4 - iVar11,uVar7);
                          AVar1 = local_180;
                        }
                        goto switchD_00101b40_caseD_7;
                      case 6:
                        AVar3 = aAppTime();
                        iVar2 = local_b8 - a__app_state.pointer.x;
                        iVar11 = local_b4 - a__app_state.pointer.y;
                        a__app_state.pointer.x = local_b8;
                        a__app_state.pointer.y = local_b4;
                        if (a__app_state.grabbed != 0) {
                          if ((local_b8 == (int)a__app_state.width / 2) &&
                             (AVar1 = local_180, local_b4 == (int)a__app_state.height / 2))
                          goto switchD_00101b40_caseD_7;
                          XWarpPointer(a__x11_0,0,a__x11_1,0,0,0,0,a__app_state.width >> 1,
                                       a__app_state.height >> 1);
                        }
                        AVar1 = local_180;
                        if (a__app_proctable.pointer != (_func_void_ATimeUs_int_int_uint *)0x0) {
                          (*a__app_proctable.pointer)(AVar3,iVar2,iVar11,0);
                          AVar1 = local_180;
                        }
                        goto switchD_00101b40_caseD_7;
                      case 7:
                      case 8:
                      case 9:
                      case 10:
                      case 0xb:
                      case 0xc:
                      case 0xd:
                      case 0xe:
                      case 0xf:
                      case 0x10:
                        goto switchD_00101b40_caseD_7;
                      case 0x11:
                      case 0x12:
                        goto switchD_00101b40_caseD_11;
                      default:
                        if ((int)xvisual_info.visual == 0x16) {
                          uVar7 = a__app_state.width;
                          if (a__app_state.height != xvisual_info.bits_per_rgb ||
                              a__app_state.width != xvisual_info.colormap_size) {
                            a__app_state.width = xvisual_info.colormap_size;
                            a__app_state.height = xvisual_info.bits_per_rgb;
                            AVar3 = aAppTime();
                            AVar1 = local_180;
                            if (a__app_proctable.resize != (_func_void_ATimeUs_uint_uint *)0x0) {
                              (*a__app_proctable.resize)(AVar3,uVar7,uVar9);
                              AVar1 = local_180;
                            }
                          }
                        }
                        else if ((int)xvisual_info.visual == 0x21) goto switchD_00101b40_caseD_11;
                        goto switchD_00101b40_caseD_7;
                      }
                    }
                    pcVar10 = 
                    "eglMakeCurrent(a_app_egl_display, a__app_egl.surface, a__app_egl.surface, a__app_egl.context)"
                    ;
                    uVar4 = 0x150;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010226e:
  aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                  "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/src/app_x11.c",uVar4
                  ,pcVar10);
  exit(-1);
switchD_00101b40_caseD_11:
  if (a__app_proctable.close != (_func_void *)0x0) {
    (*a__app_proctable.close)();
  }
  aAppDebugPrintf("cleaning up");
  if (a_app_egl_display != (EGLDisplay)0x0) {
    eglTerminate();
    XDestroyWindow(a__x11_0,a__x11_1);
    XCloseDisplay(a__x11_0);
    return 0;
  }
  pcVar10 = "a_app_egl_display != EGL_NO_DISPLAY";
  uVar4 = 0x19d;
  goto LAB_0010226e;
}

Assistant:

int main(int argc, char *argv[]) {
	ATimeUs timestamp = aAppTime();
	XSetWindowAttributes winattrs;
	Atom delete_message;
#ifndef ATTO_EGL
	int nglxconfigs = 0;
	GLXFBConfig *glxconfigs = NULL;
#endif
	XVisualInfo *vinfo = NULL;
	ATimeUs last_paint = 0;

	ATTO_ASSERT(a__x11.display = XOpenDisplay(NULL));

#ifndef ATTO_EGL
	ATTO_ASSERT(glxconfigs = glXChooseFBConfig(a__x11.display, 0, a__glxattribs, &nglxconfigs));
	ATTO_ASSERT(nglxconfigs);

	ATTO_ASSERT(vinfo = glXGetVisualFromFBConfig(a__x11.display, glxconfigs[0]));

#else
	EGLint ver_min, ver_maj;
	EGLConfig config;
	EGLint num_config;

	eglBindAPI(EGL_OPENGL_API);

	ATTO_ASSERT(EGL_NO_DISPLAY != (a_app_egl_display = eglGetDisplay(a__x11.display)));
	ATTO_ASSERT(eglInitialize(a_app_egl_display, &ver_maj, &ver_min));

	aAppDebugPrintf("EGL: version %d.%d", ver_maj, ver_min);
	aAppDebugPrintf("EGL: EGL_VERSION: '%s'",
		eglQueryString(a_app_egl_display, EGL_VERSION));
	aAppDebugPrintf("EGL: EGL_VENDOR: '%s'",
		eglQueryString(a_app_egl_display, EGL_VENDOR));
	aAppDebugPrintf("EGL: EGL_CLIENT_APIS: '%s'",
		eglQueryString(a_app_egl_display, EGL_CLIENT_APIS));
	aAppDebugPrintf("EGL: EGL_EXTENSIONS: '%s'",
		eglQueryString(a_app_egl_display, EGL_EXTENSIONS));

	ATTO_ASSERT(eglChooseConfig(a_app_egl_display, a__app_egl_config_attrs,
		&config, 1, &num_config));

	ATTO_ASSERT(num_config > 0);

	{
		XVisualInfo xvisual_info = {0};
		int num_visuals;
		ATTO_ASSERT(eglGetConfigAttrib(a_app_egl_display, config, EGL_NATIVE_VISUAL_ID, (EGLint*)&xvisual_info.visualid));
		//xvisual_info.screen = DefaultScreen(a__x11.display);

		ATTO_ASSERT(vinfo = XGetVisualInfo(a__x11.display, VisualScreenMask | VisualIDMask, &xvisual_info, &num_visuals));
	}
#endif // ATTO_EGL

	memset(&winattrs, 0, sizeof(winattrs));
	winattrs.event_mask = KeyPressMask | KeyReleaseMask | ButtonPressMask | ButtonReleaseMask | PointerMotionMask |
		ExposureMask | VisibilityChangeMask | StructureNotifyMask;
	winattrs.border_pixel = 0;
	winattrs.bit_gravity = StaticGravity;
	winattrs.colormap =
		XCreateColormap(a__x11.display, RootWindow(a__x11.display, vinfo->screen), vinfo->visual, AllocNone);
	winattrs.override_redirect = False;

	a__x11.window =
		XCreateWindow(a__x11.display, RootWindow(a__x11.display, vinfo->screen), 0, 0, ATTO_APP_WIDTH, ATTO_APP_HEIGHT, 0,
			vinfo->depth, InputOutput, vinfo->visual, CWBorderPixel | CWBitGravity | CWEventMask | CWColormap, &winattrs);
	ATTO_ASSERT(a__x11.window);

	XStoreName(a__x11.display, a__x11.window, ATTO_APP_NAME);

	delete_message = XInternAtom(a__x11.display, "WM_DELETE_WINDOW", True);
	XSetWMProtocols(a__x11.display, a__x11.window, &delete_message, 1);

	XMapWindow(a__x11.display, a__x11.window);

	XkbSetDetectableAutoRepeat(a__x11.display, True, NULL);

#ifndef ATTO_EGL
	ATTO_ASSERT(a__x11.context = glXCreateNewContext(a__x11.display, glxconfigs[0], GLX_RGBA_TYPE, 0, True));
	ATTO_ASSERT(a__x11.drawable = glXCreateWindow(a__x11.display, glxconfigs[0], a__x11.window, 0));

	glXMakeContextCurrent(a__x11.display, a__x11.drawable, a__x11.drawable, a__x11.context);
#else
	a__app_egl.context = eglCreateContext(a_app_egl_display, config,
		EGL_NO_CONTEXT, a__app_egl_context_attrs);
	ATTO_ASSERT(EGL_NO_CONTEXT != a__app_egl.context);

	a__app_egl.surface = eglCreateWindowSurface(a_app_egl_display, config, a__x11.window, 0);
	//a__app_egl.surface = eglCreatePlatformWindowSurface(a_app_egl_display, config, &native_window, 0);
	ATTO_ASSERT(EGL_NO_SURFACE != a__app_egl.surface);

	ATTO_ASSERT(eglMakeCurrent(a_app_egl_display, a__app_egl.surface,
		a__app_egl.surface, a__app_egl.context));
#endif // !ATTO_EGL

	XSelectInput(a__x11.display, a__x11.window,
		StructureNotifyMask | KeyPressMask | KeyReleaseMask | ButtonPressMask | ButtonReleaseMask | PointerMotionMask);
	a__app_state.argc = argc;
	a__app_state.argv = (const char *const *)argv;
	a__app_state.gl_version = AOGLV_21;
	a__app_state.width = ATTO_APP_WIDTH;
	a__app_state.height = ATTO_APP_HEIGHT;

	ATTO_APP_INIT_FUNC(&a__app_proctable);

	if (a__app_proctable.resize)
		a__app_proctable.resize(timestamp, 0, 0);

	for (;;) {
		while (XPending(a__x11.display)) {
			XEvent e;
			XNextEvent(a__x11.display, &e);
			switch (e.type) {
			case ConfigureNotify: {
				unsigned int oldw = a__app_state.width, oldh = a__app_state.height;

				if (a__app_state.width == (unsigned int)e.xconfigure.width &&
					a__app_state.height == (unsigned int)e.xconfigure.height)
					break;

				a__app_state.width = e.xconfigure.width;
				a__app_state.height = e.xconfigure.height;
				timestamp = aAppTime();

				if (a__app_proctable.resize)
					a__app_proctable.resize(timestamp, oldw, oldh);
			} break;

			case ButtonPress:
			case ButtonRelease: a__appProcessXButton(&e); break;
			case MotionNotify: a__appProcessXMotion(&e); break;
			case KeyPress:
			case KeyRelease: a__appProcessXKeyEvent(&e); break;

			case ClientMessage:
			case DestroyNotify:
			case UnmapNotify: goto exit; break;
			}
		}

		{
			ATimeUs now = aAppTime();
			float dt;
			if (!last_paint)
				last_paint = now;
			dt = (now - last_paint) * 1e-6f;

			if (a__app_proctable.paint)
				a__app_proctable.paint(now, dt);

#ifndef ATTO_EGL
			glXSwapBuffers(a__x11.display, a__x11.drawable);
#else
			ATTO_ASSERT(eglSwapBuffers(a_app_egl_display, a__app_egl.surface));
#endif
			last_paint = now;
		}
	}

exit:
	if (a__app_proctable.close)
		a__app_proctable.close();

	aAppDebugPrintf("cleaning up");
#ifndef ATTO_EGL
	glXMakeContextCurrent(a__x11.display, 0, 0, 0);
	glXDestroyWindow(a__x11.display, a__x11.drawable);
	glXDestroyContext(a__x11.display, a__x11.context);
#else
	ATTO_ASSERT(a_app_egl_display != EGL_NO_DISPLAY);
	eglTerminate(a_app_egl_display);
#endif
	XDestroyWindow(a__x11.display, a__x11.window);
	XCloseDisplay(a__x11.display);

	return 0;
}